

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_smod(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  byte bVar2;
  byte bVar3;
  BtorSimBitVector *b_00;
  BtorSimBitVector *bv;
  int *in_RDI;
  _Bool b_positive;
  _Bool a_positive;
  BtorSimBitVector *neg_urem;
  BtorSimBitVector *urem;
  BtorSimBitVector *cond_b;
  BtorSimBitVector *cond_a;
  BtorSimBitVector *add;
  BtorSimBitVector *neg_b;
  BtorSimBitVector *neg_a;
  BtorSimBitVector *sign_b;
  BtorSimBitVector *sign_a;
  BtorSimBitVector *not_b;
  BtorSimBitVector *res;
  BtorSimBitVector *in_stack_ffffffffffffff58;
  BtorSimBitVector *in_stack_ffffffffffffff60;
  BtorSimBitVector *in_stack_ffffffffffffff68;
  BtorSimBitVector *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  BtorSimBitVector *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff90;
  undefined8 local_18;
  
  if (*in_RDI == 1) {
    btorsim_bv_not(in_stack_ffffffffffffff60);
    local_18 = btorsim_bv_and(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    btorsim_bv_free((BtorSimBitVector *)0x13b49f);
  }
  else {
    btorsim_bv_slice(in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffff78);
    btorsim_bv_slice(in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffff78);
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff58);
    bVar2 = (_Var1 ^ 0xffU) & 1;
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff58);
    bVar3 = (_Var1 ^ 0xffU) & 1;
    btorsim_bv_neg(in_stack_ffffffffffffff70);
    btorsim_bv_neg(in_stack_ffffffffffffff70);
    if ((bVar2 & 1) == 0) {
      b_00 = btorsim_bv_copy(in_stack_ffffffffffffff60);
    }
    else {
      b_00 = btorsim_bv_copy(in_stack_ffffffffffffff60);
    }
    if ((bVar3 & 1) == 0) {
      btorsim_bv_copy(in_stack_ffffffffffffff60);
    }
    else {
      btorsim_bv_copy(in_stack_ffffffffffffff60);
    }
    bv = btorsim_bv_urem(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    _Var1 = btorsim_bv_is_zero(bv);
    if (_Var1) {
      btorsim_bv_new((uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    else {
      btorsim_bv_copy(in_stack_ffffffffffffff60);
    }
    btorsim_bv_neg(in_stack_ffffffffffffff70);
    if (((bVar2 & 1) == 0) || ((bVar3 & 1) == 0)) {
      if (((bVar2 & 1) == 0) && ((bVar3 & 1) != 0)) {
        local_18 = btorsim_bv_add((BtorSimBitVector *)
                                  CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffff90)),b_00);
      }
      else if (((bVar2 & 1) == 0) || ((bVar3 & 1) != 0)) {
        local_18 = btorsim_bv_copy(in_stack_ffffffffffffff60);
      }
      else {
        local_18 = btorsim_bv_add((BtorSimBitVector *)
                                  CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffff90)),b_00);
      }
    }
    else {
      local_18 = btorsim_bv_copy(in_stack_ffffffffffffff60);
    }
    btorsim_bv_free((BtorSimBitVector *)0x13b6bb);
    btorsim_bv_free((BtorSimBitVector *)0x13b6c5);
    btorsim_bv_free((BtorSimBitVector *)0x13b6cf);
    btorsim_bv_free((BtorSimBitVector *)0x13b6d9);
    btorsim_bv_free((BtorSimBitVector *)0x13b6e3);
    btorsim_bv_free((BtorSimBitVector *)0x13b6ed);
    btorsim_bv_free((BtorSimBitVector *)0x13b6f7);
    btorsim_bv_free((BtorSimBitVector *)0x13b701);
    btorsim_bv_free((BtorSimBitVector *)0x13b70b);
  }
  return local_18;
}

Assistant:

BtorSimBitVector *
btorsim_bv_smod (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b, *add;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;
  bool a_positive, b_positive;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    a_positive = !btorsim_bv_is_true (sign_a);
    b_positive = !btorsim_bv_is_true (sign_b);

    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    cond_a = a_positive ? btorsim_bv_copy (a)
                        : btorsim_bv_copy (neg_a);
    cond_b = b_positive ? btorsim_bv_copy (b)
                        : btorsim_bv_copy (neg_b);


    urem     = btorsim_bv_urem (cond_a, cond_b);
    add = btorsim_bv_is_zero(urem) ? btorsim_bv_zero(b->width)
                                   : btorsim_bv_copy(b);

    neg_urem = btorsim_bv_neg (urem);

    res =  a_positive &&  b_positive ? btorsim_bv_copy(urem)
        : !a_positive &&  b_positive ? btorsim_bv_add(neg_urem, add)
        :  a_positive && !b_positive ? btorsim_bv_add(urem, add)
                                     : btorsim_bv_copy(neg_urem);

    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (add);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}